

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_iostream_operator_unit_test.cpp
# Opt level: O0

void __thiscall
iostream_operator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>::test_method
          (iostream_operator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
           *this)

{
  bool bVar1;
  type_conflict3 tVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  void *pvVar6;
  Filtration_simplex_range *pFVar7;
  undefined8 uVar8;
  reference pvVar9;
  Filtration_value *pFVar10;
  lazy_ostream *prev;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  SVar11;
  basic_cstring<const_char> local_7f0;
  basic_cstring<const_char> local_7e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_7d0;
  assertion_result local_7b0;
  basic_cstring<const_char> local_798;
  basic_cstring<const_char> local_788;
  reference local_774;
  Siblings *pSStack_770;
  int vertex_1;
  Vertex_handle local_768;
  Siblings *local_760;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __end0_3;
  Siblings *local_740;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __begin0_3;
  iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  local_728;
  iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  *local_708;
  Simplex_vertex_range *__range2_1;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_6f8;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  f_simplex_1;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  Filtration_simplex_range *__range1_1;
  ifstream simplex_tree_istream;
  undefined1 local_4c8 [8];
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> read_st;
  ofstream simplex_tree_ostream;
  allocator<char> local_239;
  string local_238 [8];
  string iostream_file;
  int vertex;
  Siblings *local_200;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __end0_1;
  Siblings *local_1e0;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
  __begin0_1;
  iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  local_1c8;
  iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
  *local_1a8;
  Simplex_vertex_range *__range2;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_198;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  f_simplex;
  const_iterator __end0;
  const_iterator __begin0;
  Filtration_simplex_range *__range1;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 *local_150;
  size_t local_148;
  undefined1 local_140 [28];
  undefined4 local_124;
  pointer local_120;
  size_t local_118;
  undefined1 local_110 [24];
  Vertex_handle local_f8;
  undefined4 local_f4;
  pointer local_f0;
  size_t local_e8;
  undefined1 local_d0 [40];
  pointer local_a8;
  __node_base_ptr local_a0;
  undefined1 local_98 [8];
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> st;
  iostream_operator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_> *this_local;
  
  st._128_8_ = this;
  poVar4 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::clog,"SIMPLEX TREE IOSTREAM OPERATOR");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  local_d0._24_4_ = 0;
  local_d0._28_4_ = 1;
  local_d0._32_4_ = 8.40779e-45;
  local_d0._36_4_ = 7;
  local_a8 = (pointer)(local_d0 + 0x18);
  local_a0 = (__node_base_ptr)0x4;
  local_d0._20_4_ = 0x40800000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_d0,
             (initializer_list<int> *)local_98,(Filtration_value *)(local_d0 + 0x28));
  local_110._20_4_ = 3;
  local_f8 = 4;
  local_f4 = 5;
  local_f0 = (pointer)(local_110 + 0x14);
  local_e8 = 3;
  local_110._16_4_ = 0x40400000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_110,
             (initializer_list<int> *)local_98,(Filtration_value *)&local_f0);
  local_140._24_4_ = 3;
  local_124 = 0;
  local_120 = (pointer)(local_140 + 0x18);
  local_118 = 2;
  local_140._20_4_ = 0x40000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_140,
             (initializer_list<int> *)local_98,(Filtration_value *)&local_120);
  local_15c = 2;
  local_158 = 1;
  local_154 = 0;
  local_150 = &local_15c;
  local_148 = 3;
  local_160 = 0x40400000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)&__range1,
             (initializer_list<int> *)local_98,(Filtration_value *)&local_150);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::initialize_filtration
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98,false);
  poVar4 = std::operator<<((ostream *)&std::clog,"The ORIGINAL complex contains ");
  sVar5 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::num_simplices
                    ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  poVar4 = std::operator<<(poVar4," simplices - dimension = ");
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::dimension
                    ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,iVar3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  pvVar6 = (void *)std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,
                           "Iterator on Simplices in the filtration, with [filtration value]:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pFVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
           filtration_simplex_range
                     ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  __end0 = std::
           vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
           ::begin(pFVar7);
  f_simplex.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
        *)std::
          vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
          ::end(pFVar7);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>_>
                                     *)&f_simplex), bVar1) {
    pvVar9 = __gnu_cxx::
             __normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>_>
             ::operator*(&__end0);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator(&local_198,pvVar9);
    poVar4 = std::operator<<((ostream *)&std::clog,"   ");
    poVar4 = std::operator<<(poVar4,"[");
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                    *)&__range2,&local_198);
    pFVar10 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::filtration
                        ((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                          *)&__range2);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pFVar10);
    std::operator<<(poVar4,"] ");
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                    *)&__begin0_1.v_,&local_198);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex_vertex_range
              ((Simplex_vertex_range *)&local_1c8,
               (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98,
               (Simplex_handle *)&__begin0_1.v_);
    local_1a8 = &local_1c8;
    SVar11 = boost::iterator_range_detail::
             iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             ::begin(local_1a8);
    __end0_1._8_8_ = SVar11.sib_;
    __begin0_1.sib_._0_4_ = SVar11.v_;
    local_1e0 = (Siblings *)__end0_1._8_8_;
    SVar11 = boost::iterator_range_detail::
             iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             ::end(local_1a8);
    local_200 = SVar11.sib_;
    __end0_1.sib_._0_4_ = SVar11.v_;
    while (tVar2 = boost::iterators::operator!=
                             ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                               *)&local_1e0,
                              (iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                               *)&local_200), tVar2) {
      iostream_file.field_2._12_4_ =
           boost::iterators::detail::
           iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
           ::operator*((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                        *)&local_1e0);
      poVar4 = (ostream *)std::ostream::operator<<(&std::clog,iostream_file.field_2._12_4_);
      std::operator<<(poVar4," ");
      boost::iterators::detail::
      iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
      ::operator++((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                    *)&local_1e0);
    }
    std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>_>
    ::operator++(&__end0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"simplex_tree_for_iostream_operator_unit_test.txt",&local_239);
  std::allocator<char>::~allocator(&local_239);
  uVar8 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(&read_st.dimension_,uVar8,0x10);
  Gudhi::operator<<((ostream *)&read_st.dimension_,
                    (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  std::ofstream::close();
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_4c8);
  uVar8 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(&__range1_1,uVar8,8);
  Gudhi::operator>>((istream *)&__range1_1,
                    (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_4c8);
  poVar4 = std::operator<<((ostream *)&std::clog,"The READ complex contains ");
  sVar5 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::num_simplices
                    ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_4c8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  poVar4 = std::operator<<(poVar4," simplices - dimension = ");
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::dimension
                    ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_4c8);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,iVar3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  pvVar6 = (void *)std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,
                           "Iterator on Simplices in the filtration, with [filtration value]:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pFVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
           filtration_simplex_range
                     ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_4c8);
  __end0_2 = std::
             vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
             ::begin(pFVar7);
  f_simplex_1.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
        *)std::
          vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
          ::end(pFVar7);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_2,
                            (__normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>_>
                             *)&f_simplex_1), bVar1) {
    pvVar9 = __gnu_cxx::
             __normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>_>
             ::operator*(&__end0_2);
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator(&local_6f8,pvVar9);
    poVar4 = std::operator<<((ostream *)&std::clog,"   ");
    poVar4 = std::operator<<(poVar4,"[");
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                    *)&__range2_1,&local_6f8);
    pFVar10 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::filtration
                        ((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                          *)&__range2_1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pFVar10);
    std::operator<<(poVar4,"] ");
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
    ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                    *)&__begin0_3.v_,&local_6f8);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex_vertex_range
              ((Simplex_vertex_range *)&local_728,
               (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_4c8,
               (Simplex_handle *)&__begin0_3.v_);
    local_708 = &local_728;
    SVar11 = boost::iterator_range_detail::
             iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             ::begin(local_708);
    __end0_3._8_8_ = SVar11.sib_;
    __begin0_3.sib_._0_4_ = SVar11.v_;
    local_740 = (Siblings *)__end0_3._8_8_;
    SVar11 = boost::iterator_range_detail::
             iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_boost::iterators::incrementable_traversal_tag>
             ::end(local_708);
    pSStack_770 = SVar11.sib_;
    local_768 = SVar11.v_;
    local_760 = pSStack_770;
    __end0_3.sib_._0_4_ = local_768;
    while (tVar2 = boost::iterators::operator!=
                             ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                               *)&local_740,
                              (iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                               *)&local_760), tVar2) {
      local_774 = boost::iterators::detail::
                  iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                  ::operator*((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                               *)&local_740);
      poVar4 = (ostream *)std::ostream::operator<<(&std::clog,local_774);
      std::operator<<(poVar4," ");
      boost::iterators::detail::
      iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
      ::operator++((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                    *)&local_740);
    }
    std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_*,_std::vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>_>
    ::operator++(&__end0_2);
  }
  do {
    uVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_788,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_iostream_operator_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_798);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar8,&local_788,0x5f,&local_798);
    bVar1 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::operator==
                      ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98,
                       (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_4c8);
    boost::test_tools::assertion_result::assertion_result(&local_7b0,bVar1);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e0,"st == read_st",0xd);
    boost::unit_test::operator<<(&local_7d0,prev,&local_7e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_iostream_operator_unit_test.cpp"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion(&local_7b0,&local_7d0,&local_7f0,0x5f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_7d0);
    boost::test_tools::assertion_result::~assertion_result(&local_7b0);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::ifstream::~ifstream(&__range1_1);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::~Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_4c8);
  std::ofstream::~ofstream(&read_st.dimension_);
  std::__cxx11::string::~string(local_238);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::~Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_98);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(iostream_operator, Stree_type, list_of_tested_variants) {
  std::clog << "********************************************************************" << std::endl;
  std::clog << "SIMPLEX TREE IOSTREAM OPERATOR" << std::endl;

  Stree_type st;

  st.insert_simplex_and_subfaces({0, 1, 6, 7}, 4.0);
  st.insert_simplex_and_subfaces({3, 4, 5}, 3.0);
  st.insert_simplex_and_subfaces({3, 0}, 2.0);
  st.insert_simplex_and_subfaces({2, 1, 0}, 3.0);

  st.initialize_filtration();
  // Display the Simplex_tree
  std::clog << "The ORIGINAL complex contains " << st.num_simplices() << " simplices - dimension = "
            << st.dimension() << std::endl;
  std::clog << std::endl << std::endl << "Iterator on Simplices in the filtration, with [filtration value]:" << std::endl;
  for (auto f_simplex : st.filtration_simplex_range()) {
    std::clog << "   " << "[" << st.filtration(f_simplex) << "] ";
    for (auto vertex : st.simplex_vertex_range(f_simplex)) {
      std::clog << (int) vertex << " ";
    }
    std::clog << std::endl;
  }

  // st:
  //    1   6
  //    o---o
  //   /X\7/
  //  o---o---o---o
  //  2   0   3\X/4
  //            o
  //            5
  std::string iostream_file("simplex_tree_for_iostream_operator_unit_test.txt");
  std::ofstream simplex_tree_ostream(iostream_file.c_str());
  simplex_tree_ostream << st;
  simplex_tree_ostream.close();

  Stree_type read_st;
  std::ifstream simplex_tree_istream(iostream_file.c_str());
  simplex_tree_istream >> read_st;

  // Display the Simplex_tree
  std::clog << "The READ complex contains " << read_st.num_simplices() << " simplices - dimension = "
            << read_st.dimension() << std::endl;
  std::clog << std::endl << std::endl << "Iterator on Simplices in the filtration, with [filtration value]:" << std::endl;
  for (auto f_simplex : read_st.filtration_simplex_range()) {
    std::clog << "   " << "[" << read_st.filtration(f_simplex) << "] ";
    for (auto vertex : read_st.simplex_vertex_range(f_simplex)) {
      std::clog << (int) vertex << " ";
    }
    std::clog << std::endl;
  }

  BOOST_CHECK(st == read_st);
}